

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *cp)

{
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  int n;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff68;
  TPZGeoMesh *in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  TPZGeoMesh *in_stack_ffffffffffffff80;
  TPZQuadSphere<pzgeom::TPZGeoQuad> *in_stack_ffffffffffffff88;
  TPZQuadSphere<pzgeom::TPZGeoQuad> *in_stack_ffffffffffffff90;
  TPZRegisterClassId *local_60;
  int local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02468b90);
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02468878;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02468878;
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TPZQuadSphere
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_60 = in_RDI + 0x90;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff70);
    local_60 = local_60 + 0x18;
  } while (local_60 != in_RDI + 0x168);
  for (local_38 = 0; local_38 < 9; local_38 = local_38 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_38 * 0x18 + 0x90),
               (TPZGeoElSideIndex *)(in_RDX + 0x90 + (long)local_38 * 0x18));
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}